

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr.c
# Opt level: O1

Vec_Ptr_t * Saig_ManDetectConstrCheckCont(Vec_Ptr_t *vSuper,Vec_Ptr_t *vSuper2)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  
  if (0 < (long)vSuper2->nSize) {
    lVar9 = 0;
    do {
      if (vSuper->nSize < 1) {
        return (Vec_Ptr_t *)0x0;
      }
      uVar8 = 0;
      while (vSuper->pArray[uVar8] != vSuper2->pArray[lVar9]) {
        uVar8 = uVar8 + 1;
        if ((uint)vSuper->nSize == uVar8) {
          return (Vec_Ptr_t *)0x0;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != vSuper2->nSize);
  }
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  if (0 < vSuper->nSize) {
    lVar9 = 0;
    do {
      pvVar3 = vSuper->pArray[lVar9];
      if (0 < (long)vSuper2->nSize) {
        lVar6 = 0;
        do {
          if (vSuper2->pArray[lVar6] == pvVar3) goto LAB_0064841d;
          lVar6 = lVar6 + 1;
        } while (vSuper2->nSize != lVar6);
      }
      uVar1 = pVVar4->nSize;
      uVar2 = pVVar4->nCap;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
          }
          iVar7 = 0x10;
        }
        else {
          iVar7 = uVar2 * 2;
          if (iVar7 <= (int)uVar2) goto LAB_0064840e;
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
          }
        }
        pVVar4->pArray = ppvVar5;
        pVVar4->nCap = iVar7;
      }
LAB_0064840e:
      pVVar4->nSize = uVar1 + 1;
      pVVar4->pArray[(int)uVar1] = pvVar3;
LAB_0064841d:
      lVar9 = lVar9 + 1;
    } while (lVar9 < vSuper->nSize);
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Saig_ManDetectConstrCheckCont( Vec_Ptr_t * vSuper, Vec_Ptr_t * vSuper2 )
{
    Vec_Ptr_t * vUnique;
    Aig_Obj_t * pObj, * pObj2;
    int i;
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper2, pObj2, i )
        if ( Vec_PtrFind( vSuper, pObj2 ) == -1 )
            return 0;
    vUnique = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pObj, i )
        if ( Vec_PtrFind( vSuper2, pObj ) == -1 )
            Vec_PtrPush( vUnique, pObj );
    return vUnique;
}